

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateAppBundle(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  bool bVar1;
  string local_b0;
  undefined1 local_90 [8];
  string plist;
  undefined1 local_40 [8];
  string out;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = outpath;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)local_40,(string *)out.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    cmGeneratorTarget::GetAppBundleDirectory
              ((string *)((long)&plist.field_2 + 8),this->GT,&this->ConfigName,FullLevel);
    std::__cxx11::string::operator+=((string *)local_40,(string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(plist.field_2._M_local_buf + 8));
    cmsys::SystemTools::MakeDirectory((string *)local_40,(mode_t *)0x0);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_40);
    std::__cxx11::string::string((string *)local_90,(string *)out.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_90,"/");
    cmGeneratorTarget::GetAppBundleDirectory(&local_b0,this->GT,&this->ConfigName,ContentLevel);
    std::__cxx11::string::operator+=((string *)local_90,(string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::operator+=((string *)local_90,"/Info.plist");
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,targetName,(string *)local_90);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_90);
    std::__cxx11::string::operator=((string *)out.field_2._8_8_,(string *)local_40);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = outpath;
  out += "/";
  out += this->GT->GetAppBundleDirectory(this->ConfigName,
                                         cmGeneratorTarget::FullLevel);
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = outpath;
  plist += "/";
  plist += this->GT->GetAppBundleDirectory(this->ConfigName,
                                           cmGeneratorTarget::ContentLevel);
  plist += "/Info.plist";
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, targetName, plist);
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = out;
}